

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_kaku.c
# Opt level: O0

uint8_t * encode_kaku(uint8_t *enc_data,uint8_t b)

{
  int local_18;
  byte local_11;
  int i;
  uint8_t b_local;
  uint8_t *enc_data_local;
  
  local_11 = b;
  _i = enc_data;
  for (local_18 = 8; 0 < local_18; local_18 = local_18 + -1) {
    if ((local_11 & 0x80) == 0) {
      *_i = 0xff;
      _i[1] = '\0';
      _i[2] = 0xff;
      _i[3] = '\0';
      _i[4] = '\0';
      _i[5] = '\0';
      _i[6] = '\0';
    }
    else {
      *_i = 0xff;
      _i[1] = '\0';
      _i[2] = '\0';
      _i[3] = '\0';
      _i[4] = '\0';
      _i[5] = 0xff;
      _i[6] = '\0';
    }
    local_11 = local_11 << 1;
    _i = _i + 7;
  }
  return _i;
}

Assistant:

static uint8_t *encode_kaku(uint8_t *enc_data, uint8_t b) 
{
	int i;

	i=8;
	while (i > 0) {
		if (b & 0x80) {
			enc_data[0] = 0xff;
			enc_data[1] = 0x00;
			enc_data[2] = 0x00;
			enc_data[3] = 0x00;
			enc_data[4] = 0x00;
			enc_data[5] = 0xff;
			enc_data[6] = 0x00;
		} else {
			enc_data[0] = 0xff;
			enc_data[1] = 0x00;
			enc_data[2] = 0xff;
			enc_data[3] = 0x00;
			enc_data[4] = 0x00;
			enc_data[5] = 0x00;
			enc_data[6] = 0x00;
		}
		b <<= 1;

		enc_data += 7;
		i--;
	}

	return enc_data;
}